

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O0

int mbedtls_mpi_core_read_be(mbedtls_mpi_uint *X,size_t X_limbs,uchar *input,size_t input_length)

{
  uchar *Xp;
  size_t overhead;
  size_t limbs;
  size_t input_length_local;
  uchar *input_local;
  size_t X_limbs_local;
  mbedtls_mpi_uint *X_local;
  
  if (X_limbs < (input_length >> 3) + (long)(int)(uint)((input_length & 7) != 0)) {
    X_local._4_4_ = -8;
  }
  else if (X_limbs == 0) {
    X_local._4_4_ = 0;
  }
  else {
    memset(X,0,X_limbs << 3);
    if (input_length != 0) {
      memcpy((void *)((long)X + (X_limbs * 8 - input_length)),input,input_length);
    }
    mbedtls_mpi_core_bigendian_to_host(X,X_limbs);
    X_local._4_4_ = 0;
  }
  return X_local._4_4_;
}

Assistant:

int mbedtls_mpi_core_read_be(mbedtls_mpi_uint *X,
                             size_t X_limbs,
                             const unsigned char *input,
                             size_t input_length)
{
    const size_t limbs = CHARS_TO_LIMBS(input_length);

    if (X_limbs < limbs) {
        return MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL;
    }

    /* If X_limbs is 0, input_length must also be 0 (from previous test).
     * Nothing to do. */
    if (X_limbs == 0) {
        return 0;
    }

    memset(X, 0, X_limbs * ciL);

    /* memcpy() with (NULL, 0) is undefined behaviour */
    if (input_length != 0) {
        size_t overhead = (X_limbs * ciL) - input_length;
        unsigned char *Xp = (unsigned char *) X;
        memcpy(Xp + overhead, input, input_length);
    }

    mbedtls_mpi_core_bigendian_to_host(X, X_limbs);

    return 0;
}